

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2sVertexArrayTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Stress::anon_unknown_1::SingleVertexArrayUsageTests::init
          (SingleVertexArrayUsageTests *this,EVP_PKEY_CTX *ctx)

{
  InputType type;
  Usage usage_;
  GLValue max_;
  int iVar1;
  MultiVertexArrayTest *this_00;
  long lVar2;
  bool bVar3;
  GLValue GVar4;
  Spec spec;
  string name;
  ArraySpec arraySpec;
  long local_f0;
  undefined1 local_e0 [16];
  pointer local_d0;
  pointer pAStack_c8;
  pointer local_c0;
  long local_b8;
  string local_b0;
  InputType local_90;
  undefined4 uStack_8c;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_88;
  InputType local_80;
  undefined4 uStack_7c;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_78;
  ArraySpec local_70;
  
  local_b8 = 0;
  do {
    type = (&DAT_01c0f670)[local_b8];
    local_f0 = 0;
    do {
      lVar2 = 0;
      do {
        iVar1 = deqp::gls::Array::inputTypeSize(type);
        usage_ = *(Usage *)((long)&DAT_01bf57cc + lVar2);
        GVar4 = deqp::gls::GLValue::getMinValue(type);
        aStack_78 = GVar4.field_1;
        local_80 = GVar4.type;
        GVar4 = deqp::gls::GLValue::getMaxValue(type);
        aStack_88 = GVar4.field_1;
        local_90 = GVar4.type;
        max_._4_4_ = uStack_8c;
        max_.type = local_90;
        GVar4._4_4_ = uStack_7c;
        GVar4.type = local_80;
        GVar4.field_1 = aStack_78;
        max_.field_1 = aStack_88;
        deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                  (&local_70,type,OUTPUTTYPE_VEC2,STORAGE_BUFFER,usage_,2,0,0x11,false,GVar4,max_);
        local_d0 = (pointer)0x0;
        pAStack_c8 = (pointer)0x0;
        local_c0 = (pointer)0x0;
        local_e0._0_4_ = PRIMITIVE_TRIANGLES;
        local_e0._4_4_ = (&DAT_01c0f870)[local_f0];
        local_e0._8_4_ = 0;
        std::
        vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
        ::_M_realloc_insert<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec_const&>
                  ((vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
                    *)&local_d0,(iterator)0x0,&local_70);
        deqp::gls::MultiVertexArrayTest::Spec::getName_abi_cxx11_(&local_b0,(Spec *)local_e0);
        if ((int)(0x11 % (long)iVar1) != 0) {
          this_00 = (MultiVertexArrayTest *)operator_new(0xe0);
          deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
                    (this_00,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                             m_testCtx,((this->super_TestCaseGroup).m_context)->m_renderCtx,
                     (Spec *)local_e0,local_b0._M_dataplus._M_p,local_b0._M_dataplus._M_p);
          tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if (local_d0 != (pointer)0x0) {
          operator_delete(local_d0,(long)local_c0 - (long)local_d0);
        }
        lVar2 = lVar2 + 4;
      } while (lVar2 != 0xc);
      lVar2 = local_f0 + 1;
      bVar3 = local_f0 == 0;
      local_f0 = lVar2;
    } while (bVar3);
    local_b8 = local_b8 + 1;
  } while (local_b8 != 4);
  return (int)lVar2;
}

Assistant:

void SingleVertexArrayUsageTests::init (void)
{
	// Test usage
	Array::Usage		usages[]		= {Array::USAGE_STATIC_DRAW, Array::USAGE_STREAM_DRAW, Array::USAGE_DYNAMIC_DRAW};
	int					counts[]		= {1, 256};
	int					strides[]		= {17};
	Array::InputType	inputTypes[]	= {Array::INPUTTYPE_FLOAT, Array::INPUTTYPE_FIXED, Array::INPUTTYPE_SHORT, Array::INPUTTYPE_BYTE};

	for (int inputTypeNdx = 0; inputTypeNdx < DE_LENGTH_OF_ARRAY(inputTypes); inputTypeNdx++)
	{
		for (int countNdx = 0; countNdx < DE_LENGTH_OF_ARRAY(counts); countNdx++)
		{
			for (int strideNdx = 0; strideNdx < DE_LENGTH_OF_ARRAY(strides); strideNdx++)
			{
				for (int usageNdx = 0; usageNdx < DE_LENGTH_OF_ARRAY(usages); usageNdx++)
				{
					const int	componentCount	= 2;
					const int	stride			= (strides[strideNdx] < 0 ? Array::inputTypeSize(inputTypes[inputTypeNdx]) * componentCount : strides[strideNdx]);
					const bool	aligned			= (stride % Array::inputTypeSize(inputTypes[inputTypeNdx])) == 0;
					MultiVertexArrayTest::Spec::ArraySpec arraySpec(inputTypes[inputTypeNdx],
																	Array::OUTPUTTYPE_VEC2,
																	Array::STORAGE_BUFFER,
																	usages[usageNdx],
																	componentCount,
																	0,
																	stride,
																	false,
																	GLValue::getMinValue(inputTypes[inputTypeNdx]),
																	GLValue::getMaxValue(inputTypes[inputTypeNdx]));

					MultiVertexArrayTest::Spec spec;
					spec.primitive	= Array::PRIMITIVE_TRIANGLES;
					spec.drawCount	= counts[countNdx];
					spec.first		= 0;
					spec.arrays.push_back(arraySpec);

					std::string name = spec.getName();

					if (!aligned)
						addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), name.c_str()));
				}
			}
		}
	}
}